

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

int message_get_body_amqp_sequence_in_place
              (MESSAGE_HANDLE message,size_t index,AMQP_VALUE *sequence)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  if (message == (MESSAGE_HANDLE)0x0 || sequence == (AMQP_VALUE *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x541;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x541;
    }
    pcVar4 = "Bad arguments: message = %p, sequence = %p";
    iVar2 = 0x540;
  }
  else {
    if (((message->body_amqp_value != (AMQP_VALUE)0x0) || (message->body_amqp_data_count != 0)) ||
       (message->body_amqp_sequence_count == 0)) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 == (LOGGER_LOG)0x0) {
        return 0x54a;
      }
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                ,"message_get_body_amqp_sequence_in_place",0x549,1,"Body is not of type SEQUENCE");
      return 0x54a;
    }
    if (index < message->body_amqp_sequence_count) {
      *sequence = message->body_amqp_sequence_items[index];
      return 0;
    }
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x553;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x553;
    }
    pcVar4 = "Index too high for AMQP sequence (%lu), maximum is %lu";
    iVar2 = 0x552;
    sequence = (AMQP_VALUE *)message->body_amqp_sequence_count;
    message = (MESSAGE_HANDLE)index;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
            ,"message_get_body_amqp_sequence_in_place",iVar2,1,pcVar4,message,sequence);
  return iVar3;
}

Assistant:

int message_get_body_amqp_sequence_in_place(MESSAGE_HANDLE message, size_t index, AMQP_VALUE* sequence)
{
    int result;

    if ((message == NULL) ||
        (sequence == NULL))
    {
        /* Codes_SRS_MESSAGE_01_118: [ If `message` or `sequence` is NULL, `message_get_body_amqp_sequence_in_place` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: message = %p, sequence = %p",
            message, sequence);
        result = MU_FAILURE;
    }
    else
    {
        MESSAGE_BODY_TYPE body_type = internal_get_body_type(message);
        if (body_type != MESSAGE_BODY_TYPE_SEQUENCE)
        {
            /* Codes_SRS_MESSAGE_01_120: [ If the body for `message` is not of type `MESSAGE_BODY_TYPE_SEQUENCE`, `message_get_body_amqp_sequence_in_place` shall fail and return a non-zero value. ]*/
            LogError("Body is not of type SEQUENCE");
            result = MU_FAILURE;
        }
        else
        {
            if (index >= message->body_amqp_sequence_count)
            {
                /* Codes_SRS_MESSAGE_01_119: [ If `index` indicates an AMQP sequence entry that is out of bounds, `message_get_body_amqp_sequence_in_place` shall fail and return a non-zero value. ]*/
                LogError("Index too high for AMQP sequence (%lu), maximum is %lu",
                    (unsigned long)index, (unsigned long)message->body_amqp_sequence_count);
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_MESSAGE_01_116: [ `message_get_body_amqp_sequence_in_place` shall return in `sequence` the content of the `index`th AMQP seuquence entry for the message instance identified by `message`. ]*/
                *sequence = message->body_amqp_sequence_items[index];

                /* Codes_SRS_MESSAGE_01_117: [ On success, `message_get_body_amqp_sequence_in_place` shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}